

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * __thiscall
cmGeneratorTarget::GetFrameworkDirectory
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config,
          BundleDirectoryLevel level)

{
  bool bVar1;
  string *psVar2;
  string local_130;
  byte local_10a;
  allocator<char> local_109;
  string local_108 [39];
  allocator<char> local_e1;
  string local_e0;
  cmValue local_c0;
  cmValue ext;
  string local_78;
  cmAlphaNum local_58;
  undefined1 local_25;
  BundleDirectoryLevel local_24;
  string *psStack_20;
  BundleDirectoryLevel level_local;
  string *config_local;
  cmGeneratorTarget *this_local;
  string *fpath;
  
  local_25 = 0;
  local_24 = level;
  psStack_20 = config;
  config_local = (string *)this;
  this_local = (cmGeneratorTarget *)__return_storage_ptr__;
  GetOutputName(&local_78,this,config,RuntimeBinaryArtifact);
  cmAlphaNum::cmAlphaNum(&local_58,&local_78);
  cmAlphaNum::cmAlphaNum((cmAlphaNum *)&ext,'.');
  cmStrCat<>(__return_storage_ptr__,&local_58,(cmAlphaNum *)&ext);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"BUNDLE_EXTENSION",&local_e1);
  local_c0 = GetProperty(this,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  bVar1 = cmValue::operator_cast_to_bool(&local_c0);
  local_10a = 0;
  if (bVar1) {
    psVar2 = cmValue::operator*[abi_cxx11_(&local_c0);
    std::__cxx11::string::string(local_108,(string *)psVar2);
  }
  else {
    std::allocator<char>::allocator();
    local_10a = 1;
    std::__cxx11::string::string<std::allocator<char>>(local_108,"framework",&local_109);
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_108);
  std::__cxx11::string::~string(local_108);
  if ((local_10a & 1) != 0) {
    std::allocator<char>::~allocator(&local_109);
  }
  bVar1 = anon_unknown.dwarf_baaa9c::shouldAddFullLevel(local_24);
  if ((bVar1) && (bVar1 = cmMakefile::PlatformIsAppleEmbedded(this->Makefile), !bVar1)) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"/Versions/");
    GetFrameworkVersion_abi_cxx11_(&local_130,this);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_130);
    std::__cxx11::string::~string((string *)&local_130);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetFrameworkDirectory(
  const std::string& config, BundleDirectoryLevel level) const
{
  std::string fpath = cmStrCat(
    this->GetOutputName(config, cmStateEnums::RuntimeBinaryArtifact), '.');
  cmValue ext = this->GetProperty("BUNDLE_EXTENSION");
  fpath += (ext ? *ext : "framework");
  if (shouldAddFullLevel(level) &&
      !this->Makefile->PlatformIsAppleEmbedded()) {
    fpath += "/Versions/";
    fpath += this->GetFrameworkVersion();
  }
  return fpath;
}